

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O2

void nn_binproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  nn_sinproc *self_00;
  nn_list_item *it;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  
  uVar4 = (ulong)(uint)src;
  uVar1 = *(uint *)&self[1].fn;
  uVar2 = (ulong)uVar1;
  if (uVar1 == 2) {
    if (src == 1) {
      return;
    }
    if (src == 0x6c41) {
      if (type == 1) {
        self_00 = (nn_sinproc *)nn_alloc_(0x290);
        if (self_00 != (nn_sinproc *)0x0) {
          nn_sinproc_init(self_00,1,(nn_epbase *)&self[1].shutdown_fn,self);
          it = nn_list_end((nn_list *)&self[1].stopped);
          nn_list_insert((nn_list *)&self[1].stopped,&self_00->item,it);
          nn_sinproc_accept(self_00,(nn_sinproc *)srcptr);
          return;
        }
        fprintf(_stderr,"Out of memory (%s:%d)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/binproc.c"
                ,0xe0);
        goto LAB_0011f72d;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar4 = 0x6c41;
      uVar5 = 0xe8;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 2;
      uVar5 = 0xef;
    }
  }
  else if (uVar1 == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 1;
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0xce;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 1;
      uVar5 = 0xd2;
    }
  }
  else {
    pcVar3 = "Unexpected state";
    uVar5 = 0xf6;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar4,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/binproc.c"
          ,uVar5);
LAB_0011f72d:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_binproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_binproc *binproc;
    struct nn_sinproc *peer;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, fsm);

    switch (binproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                binproc->state = NN_BINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_BINPROC_STATE_ACTIVE:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_CONNECT:
                peer = (struct nn_sinproc*) srcptr;
                sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
                alloc_assert (sinproc);
                nn_sinproc_init (sinproc, NN_BINPROC_SRC_SINPROC,
                    &binproc->item.epbase, &binproc->fsm);
                nn_list_insert (&binproc->sinprocs, &sinproc->item,
                    nn_list_end (&binproc->sinprocs));
                nn_sinproc_accept (sinproc, peer);
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        case NN_BINPROC_SRC_SINPROC:
            return;

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (binproc->state, src, type);
    }
}